

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_keygen.c
# Opt level: O0

int ulp_ring_generate_key_pair
              (size_t n,uint64_t sk,uint64_t se,uint64_t q,ulp_ring_public_key **pub_key_p,
              ulp_ring_private_key **priv_key_p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulp_ring_public_key *n_00;
  ulp_ring_private_key *q_00;
  uint64_t *result;
  uint64_t *in_RCX;
  uint64_t in_RDX;
  long in_RSI;
  ulong in_RDI;
  uint64_t *in_R8;
  uint64_t *in_R9;
  size_t i;
  int err;
  uint64_t *sa;
  ulp_ring_private_key *priv_key;
  ulp_ring_public_key *pub_key;
  size_t in_stack_ffffffffffffff98;
  ulong local_60;
  int local_4;
  
  if (((((in_RDI == 0) || (in_RSI == 0)) || (in_RDX == 0)) ||
      ((in_RCX == (uint64_t *)0x0 || (in_R8 == (uint64_t *)0x0)))) ||
     ((in_R9 == (uint64_t *)0x0 || ((uint64_t *)0x7fffffffffffffff < in_RCX)))) {
    local_4 = -2;
  }
  else {
    n_00 = ulp_ring_alloc_public_key(in_stack_ffffffffffffff98);
    q_00 = ulp_ring_alloc_private_key(in_stack_ffffffffffffff98);
    result = (uint64_t *)malloc(in_RDI << 3);
    if (((n_00 != (ulp_ring_public_key *)0x0) && (q_00 != (ulp_ring_private_key *)0x0)) &&
       (result != (uint64_t *)0x0)) {
      n_00->se = in_RDX;
      n_00->q = (uint64_t)in_RCX;
      q_00->q = (uint64_t)in_RCX;
      iVar1 = get_random_numbers(in_RCX,(size_t)in_R8,(uint64_t)in_R9);
      iVar2 = get_random_numbers(in_RCX,(size_t)in_R8,(uint64_t)in_R9);
      iVar3 = get_random_numbers(in_RCX,(size_t)in_R8,(uint64_t)in_R9);
      if ((iVar3 + iVar2 + iVar1 == 0) &&
         (iVar1 = poly_mulmod(in_R8,in_R9,(size_t)n_00,(uint64_t)q_00,result), iVar1 == 0)) {
        for (local_60 = 0; local_60 < in_RDI; local_60 = local_60 + 1) {
          n_00->p[local_60] =
               ((long)in_RCX + (n_00->p[local_60] - result[local_60])) % (ulong)in_RCX;
        }
        free(result);
        *in_R8 = (uint64_t)n_00;
        *in_R9 = (uint64_t)q_00;
        return 0;
      }
    }
    ulp_ring_free_public_key((ulp_ring_public_key *)0x1031a9);
    ulp_ring_free_private_key((ulp_ring_private_key *)0x1031b3);
    free(result);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int ulp_ring_generate_key_pair(size_t n, uint64_t sk, uint64_t se, uint64_t q, ulp_ring_public_key** pub_key_p, ulp_ring_private_key** priv_key_p) {

    if(n == 0 || sk == 0 || se == 0 || q == 0 || pub_key_p == NULL || priv_key_p == NULL || q >= 0x8000000000000000)
        return -2;

    // allocate memory for keys
    ulp_ring_public_key* pub_key = ulp_ring_alloc_public_key(n);
    ulp_ring_private_key* priv_key = ulp_ring_alloc_private_key(n);
    uint64_t* sa = malloc(n*sizeof(uint64_t));
    if(pub_key == NULL || priv_key == NULL || sa == NULL)
        goto fail;

    // store parameters in key structs
    pub_key->se = se;
    pub_key->q = q;
    priv_key->q = q;

    // sample random data
    int err = 0;
    err += get_random_numbers(pub_key->a, n, q);
    err += get_random_numbers(pub_key->p, n, sk);
    err += get_random_numbers(priv_key->s, n, sk);
    if(err != 0)
        goto fail;

    // s*a
    if(poly_mulmod(priv_key->s, pub_key->a, n, q, sa) != 0)
        goto fail;

    // p = e - s*a
    for(size_t i = 0; i < n; i++) {
        pub_key->p[i] = (pub_key->p[i] + q - sa[i]) % q;
    }

    // exit properly
    free(sa);
    *pub_key_p = pub_key;
    *priv_key_p = priv_key;
    return 0;


    // on failure, do cleanup
    fail:
        ulp_ring_free_public_key(pub_key);
        ulp_ring_free_private_key(priv_key);
        free(sa);
        return -1;

}